

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  pointer pUVar1;
  pointer pUVar2;
  
  pUVar1 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (pUVar2 != pUVar1) {
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])
              (pUVar2[-1].durationInSeconds,this,pUVar2 + -1,&pUVar2[-1].prevAssertions);
    pUVar2 = pUVar2 + -1;
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  return;
}

Assistant:

void handleUnfinishedSections() {
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
        }